

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmdblookup.c
# Opt level: O0

MMDB_lookup_result_s *
lookup_or_die(MMDB_lookup_result_s *__return_storage_ptr__,MMDB_s *mmdb,char *ipstr)

{
  FILE *__stream;
  char *pcVar1;
  char *strerr;
  int mmdb_error;
  int gai_error;
  char *ipstr_local;
  MMDB_s *mmdb_local;
  
  _mmdb_error = ipstr;
  ipstr_local = (char *)mmdb;
  MMDB_lookup_string(__return_storage_ptr__,mmdb,ipstr,(int *)((long)&strerr + 4),(int *)&strerr);
  __stream = _stderr;
  if (strerr._4_4_ != 0) {
    pcVar1 = gai_strerror(strerr._4_4_);
    fprintf(_stderr,"\n  Error from call to getaddrinfo for %s - %s\n\n",_mmdb_error,pcVar1);
    exit(3);
  }
  if ((int)strerr != 0) {
    pcVar1 = MMDB_strerror((int)strerr);
    fprintf(__stream,"\n  Got an error from the maxminddb library: %s\n\n",pcVar1);
    exit(4);
  }
  return __return_storage_ptr__;
}

Assistant:

static MMDB_lookup_result_s lookup_or_die(MMDB_s *mmdb, const char *ipstr) {
    int gai_error, mmdb_error;
    MMDB_lookup_result_s result =
        MMDB_lookup_string(mmdb, ipstr, &gai_error, &mmdb_error);

    if (0 != gai_error) {
#ifdef _WIN32
        char const *const strerr = gai_strerrorA(gai_error);
#else
        char const *const strerr = gai_strerror(gai_error);
#endif
        fprintf(stderr,
                "\n  Error from call to getaddrinfo for %s - %s\n\n",
                ipstr,
                strerr);
        exit(3);
    }

    if (MMDB_SUCCESS != mmdb_error) {
        fprintf(stderr,
                "\n  Got an error from the maxminddb library: %s\n\n",
                MMDB_strerror(mmdb_error));
        exit(4);
    }

    return result;
}